

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree_handler.c
# Opt level: O1

void bpptree_init(ion_dictionary_handler_t *handler)

{
  handler->insert = bpptree_insert;
  handler->create_dictionary = bpptree_create_dictionary;
  handler->get = bpptree_get;
  handler->update = bpptree_update;
  handler->find = bpptree_find;
  handler->remove = bpptree_delete;
  handler->delete_dictionary = bpptree_delete_dictionary;
  handler->destroy_dictionary = bpptree_destroy_dictionary;
  handler->open_dictionary = bpptree_open_dictionary;
  handler->close_dictionary = bpptree_close_dictionary;
  return;
}

Assistant:

void
bpptree_init(
	ion_dictionary_handler_t *handler
) {
	handler->insert				= bpptree_insert;
	handler->create_dictionary	= bpptree_create_dictionary;
	handler->get				= bpptree_get;
	handler->update				= bpptree_update;
	handler->find				= bpptree_find;
	handler->remove				= bpptree_delete;
	handler->delete_dictionary	= bpptree_delete_dictionary;
	handler->destroy_dictionary = bpptree_destroy_dictionary;
	handler->open_dictionary	= bpptree_open_dictionary;
	handler->close_dictionary	= bpptree_close_dictionary;
}